

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkTSDA.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkTSDA::IntLoadResidual_F(ChLinkTSDA *this,uint off,ChVectorDynamic<> *R,double c)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  double c_local;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> local_100 [56];
  StorageBaseType local_c8 [56];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
  local_90;
  
  c_local = c;
  iVar1 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar1 != '\0') {
    iVar1 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
              _vptr_ChFrame[0x10])();
    if (*(char *)(CONCAT44(extraout_var,iVar1) + 0x2c) == '\0') {
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_c8,&this->m_Qforce
                 ,0,3);
      Eigen::operator*(&local_90,&c_local,local_c8);
      iVar1 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
                _vptr_ChFrame[0x10])();
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_100,R,
                 (long)*(int *)(CONCAT44(extraout_var_00,iVar1) + 0x30),3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
                (local_100,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>_>
                  *)&local_90);
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_c8,&this->m_Qforce
                 ,3,3);
      Eigen::operator*(&local_90,&c_local,local_c8);
      iVar1 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
                _vptr_ChFrame[0x10])();
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_100,R,
                 (long)*(int *)(CONCAT44(extraout_var_01,iVar1) + 0x30) + 3,3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
                (local_100,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>_>
                  *)&local_90);
    }
    iVar1 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
              _vptr_ChFrame[0x10])();
    if (*(char *)(CONCAT44(extraout_var_02,iVar1) + 0x2c) == '\0') {
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_c8,&this->m_Qforce
                 ,6,3);
      Eigen::operator*(&local_90,&c_local,local_c8);
      iVar1 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                _vptr_ChFrame[0x10])();
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_100,R,
                 (long)*(int *)(CONCAT44(extraout_var_03,iVar1) + 0x30),3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
                (local_100,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>_>
                  *)&local_90);
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_c8,&this->m_Qforce
                 ,9,3);
      Eigen::operator*(&local_90,&c_local,local_c8);
      iVar1 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                _vptr_ChFrame[0x10])();
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_100,R,
                 (long)*(int *)(CONCAT44(extraout_var_04,iVar1) + 0x30) + 3,3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
                (local_100,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>_>
                  *)&local_90);
    }
    if (this->m_variables != (ChVariablesGenericDiagonalMass *)0x0) {
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
                ((Type *)local_c8,
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->m_Qforce,0xc,
                 this->m_nstates);
      Eigen::operator*(&local_90,&c_local,local_c8);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
                ((Type *)local_100,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)R,
                 (ulong)off,this->m_nstates);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
                (local_100,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>_>
                  *)&local_90);
    }
  }
  return;
}

Assistant:

void ChLinkTSDA::IntLoadResidual_F(const unsigned int off,  // offset in R residual
                                   ChVectorDynamic<>& R,    // result: the R residual, R += c*F
                                   const double c           // a scaling factor
) {
    if (!IsActive())
        return;

    // Add forces to connected bodies (from the current vector of forcing terms)
    if (Body1->Variables().IsActive()) {
        R.segment(Body1->Variables().GetOffset() + 0, 3) += c * m_Qforce.segment(0, 3);
        R.segment(Body1->Variables().GetOffset() + 3, 3) += c * m_Qforce.segment(3, 3);
    }
    if (Body2->Variables().IsActive()) {
        R.segment(Body2->Variables().GetOffset() + 0, 3) += c * m_Qforce.segment(6, 3);
        R.segment(Body2->Variables().GetOffset() + 3, 3) += c * m_Qforce.segment(9, 3);
    }

    // Add forcing term for internal variables
    if (m_variables) {
        R.segment(off, m_nstates) += c * m_Qforce.segment(12, m_nstates);
    }
}